

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::char_writer>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
           *this,align_spec *spec,char_writer *f)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  char __tmp;
  char local_5a;
  char local_59;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_40;
  char_writer *local_38;
  
  uVar6 = (ulong)spec->width_;
  if (uVar6 < 2) {
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this,&f->value);
    return;
  }
  cVar4 = (char)spec->fill_;
  uVar5 = uVar6 - 1;
  local_5a = cVar4;
  if (spec->align_ == ALIGN_CENTER) {
    uVar1 = uVar5 >> 1;
    local_58._M_stream = *(ostream_type **)this;
    local_58._M_string = *(char **)(this + 8);
    local_38 = f;
    if (spec->width_ != 2) {
      uVar3 = uVar1;
      local_59 = cVar4;
      local_40 = (ostream_iterator<char,_char,_std::char_traits<char>_> *)this;
      do {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a);
        uVar3 = uVar3 - 1;
        this = (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                *)local_40;
        cVar4 = local_59;
      } while (uVar3 != 0);
    }
    ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_stream = local_58._M_stream;
    ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_string = local_58._M_string;
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this,&local_38->value);
    local_58._M_stream = ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_stream;
    local_58._M_string = ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_string;
    if (uVar5 != uVar1) {
      lVar2 = (uVar1 - uVar6) + 1;
      local_5a = cVar4;
      do {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
    }
    ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_stream = local_58._M_stream;
    ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_string = local_58._M_string;
  }
  else if (spec->align_ == ALIGN_RIGHT) {
    local_58._M_stream = *(ostream_type **)this;
    local_58._M_string = *(char **)(this + 8);
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a);
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    *(ostream_type **)this = local_58._M_stream;
    *(char **)(this + 8) = local_58._M_string;
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this,&f->value);
  }
  else {
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this,&f->value);
    local_58._M_stream = *(ostream_type **)this;
    local_58._M_string = *(char **)(this + 8);
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a);
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    *(ostream_type **)this = local_58._M_stream;
    *(char **)(this + 8) = local_58._M_string;
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }